

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O2

void __thiscall Manifold_Decompose_Test::TestBody(Manifold_Decompose_Test *this)

{
  pointer pMVar1;
  char *message;
  pointer pMVar2;
  initializer_list<MeshSize> __l;
  Message local_190;
  vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> manifoldList;
  AssertHelper local_170;
  vector<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  input;
  Manifold manifolds;
  AssertionResult gtest_ar;
  
  manifoldList.super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  manifoldList.super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  manifoldList.super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manifold::Manifold::Tetrahedron();
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::
  emplace_back<manifold::Manifold>(&manifoldList,(Manifold *)&gtest_ar);
  manifold::Manifold::~Manifold((Manifold *)&gtest_ar);
  manifold::Manifold::Cube(&gtest_ar,0);
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::
  emplace_back<manifold::Manifold>(&manifoldList,(Manifold *)&gtest_ar);
  manifold::Manifold::~Manifold((Manifold *)&gtest_ar);
  manifold::Manifold::Sphere(1.0,(int)&gtest_ar);
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::
  emplace_back<manifold::Manifold>(&manifoldList,(Manifold *)&gtest_ar);
  manifold::Manifold::~Manifold((Manifold *)&gtest_ar);
  manifold::Manifold::Compose((vector *)&manifolds);
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0xc000000;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x800000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&gtest_ar;
  std::vector<MeshSize,_std::allocator<MeshSize>_>::vector
            ((vector<MeshSize,_std::allocator<MeshSize>_> *)&input,__l,(allocator_type *)&local_190)
  ;
  ExpectMeshes(&manifolds,(vector<MeshSize,_std::allocator<MeshSize>_> *)&input);
  std::_Vector_base<MeshSize,_std::allocator<MeshSize>_>::~_Vector_base
            ((_Vector_base<MeshSize,_std::allocator<MeshSize>_> *)&input);
  pMVar1 = manifoldList.super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  input.
  super__Vector_base<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  input.
  super__Vector_base<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  input.
  super__Vector_base<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (pMVar2 = manifoldList.
                super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>._M_impl.
                super__Vector_impl_data._M_start; pMVar2 != pMVar1; pMVar2 = pMVar2 + 0x10) {
    local_190.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = manifold::Manifold::OriginalID();
    local_170.data_._0_4_ = 0;
    testing::internal::CmpHelperGE<int,int>
              ((internal *)&gtest_ar,"manifold.OriginalID()","0",(int *)&local_190,(int *)&local_170
              );
    if (gtest_ar.success_ == false) {
      testing::Message::Message(&local_190);
      message = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_170,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
                 ,0xdf,message);
      testing::internal::AssertHelper::operator=(&local_170,&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_170);
      if ((long *)CONCAT44(local_190.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_190.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_190.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_190.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    manifold::Manifold::GetMeshGL((int)(MeshGLP<float,_unsigned_int> *)&gtest_ar);
    std::
    vector<manifold::MeshGLP<float,unsigned_int>,std::allocator<manifold::MeshGLP<float,unsigned_int>>>
    ::emplace_back<manifold::MeshGLP<float,unsigned_int>>
              ((vector<manifold::MeshGLP<float,unsigned_int>,std::allocator<manifold::MeshGLP<float,unsigned_int>>>
                *)&input,(MeshGLP<float,_unsigned_int> *)&gtest_ar);
    manifold::MeshGLP<float,_unsigned_int>::~MeshGLP((MeshGLP<float,_unsigned_int> *)&gtest_ar);
  }
  RelatedGL(&manifolds,&input,false,false);
  std::
  vector<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  ::~vector(&input);
  manifold::Manifold::~Manifold(&manifolds);
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::~vector(&manifoldList);
  return;
}

Assistant:

TEST(Manifold, ValidInput) {
  MeshGL tetGL = TetGL();
  Manifold tet(tetGL);
  EXPECT_FALSE(tet.IsEmpty());
  EXPECT_EQ(tet.Status(), Manifold::Error::NoError);
}